

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHullComputer.cpp
# Opt level: O2

Edge * __thiscall
cbtConvexHullInternal::newEdgePair(cbtConvexHullInternal *this,Vertex *from,Vertex *to)

{
  int iVar1;
  int iVar2;
  Edge *pEVar3;
  Edge *pEVar4;
  
  pEVar3 = Pool<cbtConvexHullInternal::Edge>::newObject(&this->edgePool);
  pEVar4 = Pool<cbtConvexHullInternal::Edge>::newObject(&this->edgePool);
  pEVar3->reverse = pEVar4;
  pEVar4->reverse = pEVar3;
  iVar1 = this->mergeStamp;
  pEVar3->copy = iVar1;
  pEVar4->copy = iVar1;
  pEVar3->target = to;
  pEVar4->target = from;
  pEVar3->face = (Face *)0x0;
  pEVar4->face = (Face *)0x0;
  iVar2 = this->usedEdgePairs;
  iVar1 = iVar2 + 1;
  this->usedEdgePairs = iVar1;
  if (this->maxUsedEdgePairs <= iVar2) {
    this->maxUsedEdgePairs = iVar1;
  }
  return pEVar3;
}

Assistant:

cbtConvexHullInternal::Edge* cbtConvexHullInternal::newEdgePair(Vertex* from, Vertex* to)
{
	cbtAssert(from && to);
	Edge* e = edgePool.newObject();
	Edge* r = edgePool.newObject();
	e->reverse = r;
	r->reverse = e;
	e->copy = mergeStamp;
	r->copy = mergeStamp;
	e->target = to;
	r->target = from;
	e->face = NULL;
	r->face = NULL;
	usedEdgePairs++;
	if (usedEdgePairs > maxUsedEdgePairs)
	{
		maxUsedEdgePairs = usedEdgePairs;
	}
	return e;
}